

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLogger.cpp
# Opt level: O0

void __thiscall
SLogLib::FileLoggerPriv::FileLoggerPriv
          (FileLoggerPriv *this,string *fileName,openmode mode,FileOpenFlag flag)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  ostream *poVar3;
  runtime_error *this_00;
  string local_1d8 [32];
  stringstream local_1b8 [8];
  stringstream _stream;
  ostream local_1a8 [392];
  FileOpenFlag local_20;
  openmode local_1c;
  FileOpenFlag flag_local;
  openmode mode_local;
  string *fileName_local;
  FileLoggerPriv *this_local;
  
  local_20 = flag;
  local_1c = mode;
  _flag_local = fileName;
  fileName_local = (string *)this;
  std::ofstream::ofstream(this);
  std::__cxx11::string::string((string *)&this->mFileName,(string *)_flag_local);
  this->mHasAutoFlush = false;
  this->mMode = local_1c;
  this->mFileOpenFlag = local_20;
  std::recursive_mutex::recursive_mutex(&this->mFileWriteMutex);
  if (this->mFileOpenFlag == Immediately) {
    _Var2 = std::__cxx11::string::c_str();
    std::ofstream::open((char *)this,_Var2);
    bVar1 = std::ofstream::is_open();
    if ((bVar1 & 1) == 0) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      poVar3 = std::operator<<(local_1a8,"SLogLib: Unable to open ");
      poVar3 = std::operator<<(poVar3,(string *)&this->mFileName);
      std::operator<<(poVar3," for writing.");
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(this_00,local_1d8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

FileLoggerPriv(const std::string& fileName, std::ios_base::openmode mode, FileOpenFlag flag)
		: mFileName(fileName), mHasAutoFlush(false), mMode(mode), mFileOpenFlag(flag)
	{
		if(mFileOpenFlag == FileOpenFlag::Immediately)
		{
			mFileHandle.open(mFileName.c_str(), mMode);
			if(!mFileHandle.is_open())
			{
				std::stringstream _stream;
				_stream << "SLogLib: Unable to open " << mFileName << " for writing.";
				throw std::runtime_error(_stream.str());
			}
		}
	}